

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O0

void __thiscall
aggreports::FillTVaR
          (aggreports *this,
          map<wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
          *tail,int summary_id,int sidx,double nextreturnperiod_value,OASIS_FLOAT tvar)

{
  mapped_type *this_00;
  value_type local_48;
  key_type local_34;
  wheatkey wk;
  OASIS_FLOAT tvar_local;
  double nextreturnperiod_value_local;
  int sidx_local;
  int summary_id_local;
  map<wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
  *tail_local;
  aggreports *this_local;
  
  local_34.summary_id = summary_id;
  local_34.sidx = sidx;
  wk.summary_id = (int)tvar;
  unique0x1000004e = nextreturnperiod_value;
  this_00 = std::
            map<wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
            ::operator[](tail,&local_34);
  local_48.retperiod = stack0xffffffffffffffd8;
  local_48.tvar = (OASIS_FLOAT)wk.summary_id;
  std::vector<TVaR,_std::allocator<TVaR>_>::push_back(this_00,&local_48);
  return;
}

Assistant:

void aggreports::FillTVaR(std::map<wheatkey, std::vector<TVaR>> &tail,
			  const int summary_id, const int sidx,
			  const double nextreturnperiod_value,
			  const OASIS_FLOAT tvar) {

  wheatkey wk;
  wk.summary_id = summary_id;
  wk.sidx = sidx;
  tail[wk].push_back({nextreturnperiod_value, tvar});

}